

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O3

void __thiscall argparse::args_t::parse_output(args_t *this,char *str)

{
  FILE *pFVar1;
  
  pFVar1 = _stdout;
  if ((str != (char *)0x0) && ((*str != '-' || (str[1] != '\0')))) {
    pFVar1 = fopen(str,"wb");
  }
  this->output = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    ERROR("failed to open the OUTPUT file %s",str);
    return;
  }
  return;
}

Assistant:

void args_t::parse_output( const char * str ) {
        if ( str && strcmp( str, "-" ) )
            output = fopen( str, "wb" );
        else
            output = stdout;
        
        if ( output == NULL )
            ERROR( "failed to open the OUTPUT file %s", str );
    }